

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean process_restart(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  boolean bVar2;
  int local_24;
  int ci;
  huff_entropy_ptr entropy;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->entropy;
  cinfo->marker->discarded_bytes =
       *(int *)&pjVar1[1].decode_mcu / 8 + cinfo->marker->discarded_bytes;
  *(undefined4 *)&pjVar1[1].decode_mcu = 0;
  bVar2 = (*cinfo->marker->read_restart_marker)(cinfo);
  if (bVar2 == 0) {
    cinfo_local._4_4_ = 0;
  }
  else {
    for (local_24 = 0; local_24 < cinfo->comps_in_scan; local_24 = local_24 + 1) {
      *(undefined4 *)((long)&pjVar1[2].start_pass + (long)local_24 * 4 + 4) = 0;
    }
    *(undefined4 *)&pjVar1[2].start_pass = 0;
    *(uint *)&pjVar1[3].decode_mcu = cinfo->restart_interval;
    if (cinfo->unread_marker == 0) {
      *(undefined4 *)((long)&pjVar1[3].start_pass + 4) = 0;
    }
    cinfo_local._4_4_ = 1;
  }
  return cinfo_local._4_4_;
}

Assistant:

LOCAL(boolean)
process_restart (j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int ci;

  /* Throw away any unused bits remaining in bit buffer; */
  /* include any full bytes in next_marker's count of discarded bytes */
  cinfo->marker->discarded_bytes += entropy->bitstate.bits_left / 8;
  entropy->bitstate.bits_left = 0;

  /* Advance past the RSTn marker */
  if (! (*cinfo->marker->read_restart_marker) (cinfo))
    return FALSE;

  /* Re-initialize DC predictions to 0 */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++)
    entropy->saved.last_dc_val[ci] = 0;
  /* Re-init EOB run count, too */
  entropy->saved.EOBRUN = 0;

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;

  /* Reset out-of-data flag, unless read_restart_marker left us smack up
   * against a marker.  In that case we will end up treating the next data
   * segment as empty, and we can avoid producing bogus output pixels by
   * leaving the flag set.
   */
  if (cinfo->unread_marker == 0)
    entropy->insufficient_data = FALSE;

  return TRUE;
}